

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O1

void __thiscall
TEST_TestHarness_c_checkUnsignedByte_Test::testBody(TEST_TestHarness_c_checkUnsignedByte_Test *this)

{
  TestTestingFixture *pTVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  uint uVar4;
  SimpleString local_30;
  
  CHECK_EQUAL_C_UBYTE_LOCATION
            (0xfe,0xfe,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x1c8);
  TestTestingFixture::setTestFunction
            ((this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture,failUnsignedByteMethod_);
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture;
  SimpleString::SimpleString(&local_30,"expected <254>\n\tbut was  <253>");
  TestTestingFixture::assertPrintContains(pTVar1,&local_30);
  SimpleString::~SimpleString(&local_30);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture;
  SimpleString::SimpleString(&local_30,"arness_c");
  TestTestingFixture::assertPrintContains(pTVar1,&local_30);
  SimpleString::~SimpleString(&local_30);
  pUVar2 = UtestShell::getCurrent();
  uVar4 = (uint)hasDestructorOfTheDestructorCheckedBeenCalled;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar4 ^ 1),"CHECK","!hasDestructorOfTheDestructorCheckedBeenCalled",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x1cd,pTVar3);
  return;
}

Assistant:

TEST(TestHarness_c, checkUnsignedByte)
{
    CHECK_EQUAL_C_UBYTE(254, 254);
    fixture->setTestFunction(failUnsignedByteMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <254>\n\tbut was  <253>");
    fixture->assertPrintContains("arness_c");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}